

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderSpectatorHud(CHud *this)

{
  int ID;
  int iVar1;
  long lVar2;
  CGameClient *pCVar3;
  ITextRender *pIVar4;
  vec2 CursorPosition;
  int iVar5;
  char *pcVar6;
  CClientData *pCVar7;
  long in_FS_OFFSET;
  float fVar8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar9;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar10;
  CTextBoundingBox CVar11;
  vec4 local_118;
  CUIRect Rect;
  char aFlag [64];
  char aBuf [128];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CComponent).m_pClient;
  ID = (pCVar3->m_Snap).m_SpecInfo.m_SpectatorID;
  iVar1 = (pCVar3->m_Snap).m_SpecInfo.m_SpecMode;
  fVar8 = this->m_Width * 0.25 + -2.0;
  Rect.x = this->m_Width - fVar8;
  Rect.y = this->m_Height + -15.0;
  Rect.h = 15.0;
  aBuf[0] = '\0';
  aBuf[1] = '\0';
  aBuf[2] = '\0';
  aBuf[3] = '\0';
  aBuf[4] = '\0';
  aBuf[5] = '\0';
  aBuf[6] = '\0';
  aBuf[7] = '\0';
  aBuf[8] = '\0';
  aBuf[9] = '\0';
  aBuf[10] = '\0';
  aBuf[0xb] = '\0';
  aBuf[0xc] = -0x33;
  aBuf[0xd] = -0x34;
  aBuf[0xe] = -0x34;
  aBuf[0xf] = '>';
  Rect.w = fVar8;
  CUIRect::Draw(&Rect,(vec4 *)aBuf,5.0,1);
  pCVar3 = (this->super_CComponent).m_pClient;
  pCVar7 = pCVar3->m_aClients + ID;
  if ((long)ID == -1) {
    pCVar7 = (CClientData *)0x1d1174;
  }
  if (pCVar3->m_pConfig->m_ClShowsocial == 0) {
    pCVar7 = (CClientData *)0x1d1174;
  }
  if ((RenderSpectatorHud()::s_SpectateLabelCursor == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderSpectatorHud()::s_SpectateLabelCursor), iVar5 != 0)) {
    CTextCursor::CTextCursor(&RenderSpectatorHud::s_SpectateLabelCursor,8.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorHud::s_SpectateLabelCursor,&__dso_handle)
    ;
    __cxa_guard_release(&RenderSpectatorHud()::s_SpectateLabelCursor);
  }
  RenderSpectatorHud::s_SpectateLabelCursor.m_CursorPos.field_1.y = this->m_Height + -13.0;
  RenderSpectatorHud::s_SpectateLabelCursor.m_CursorPos.field_0.x = (this->m_Width - fVar8) + 6.0;
  CTextCursor::Reset(&RenderSpectatorHud::s_SpectateLabelCursor,
                     (long)g_Localization.m_CurrentVersion);
  pcVar6 = Localize("Spectate","");
  str_format(aBuf,0x80,"%s: ",pcVar6);
  pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
            (pIVar4,&RenderSpectatorHud::s_SpectateLabelCursor,aBuf,0xffffffffffffffff);
  if ((RenderSpectatorHud()::s_SpectateTargetCursor == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderSpectatorHud()::s_SpectateTargetCursor), iVar5 != 0)) {
    CTextCursor::CTextCursor(&RenderSpectatorHud::s_SpectateTargetCursor,8.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorHud::s_SpectateTargetCursor,&__dso_handle
                );
    __cxa_guard_release(&RenderSpectatorHud()::s_SpectateTargetCursor);
  }
  CTextCursor::Reset(&RenderSpectatorHud::s_SpectateTargetCursor,-1);
  if (iVar1 - 2U < 2) {
    pcVar6 = "Blue Flag";
    if (iVar1 == 2) {
      pcVar6 = "Red Flag";
    }
    pcVar6 = Localize(pcVar6,"");
    str_format(aFlag,0x40,pcVar6);
    if (ID != -1) {
      str_format(aBuf,0x80,"%s (%s)",aFlag,pCVar7);
      goto LAB_0013d24a;
    }
    pCVar7 = (CClientData *)aFlag;
  }
  else if (iVar1 == 0) {
    pCVar7 = (CClientData *)Localize("Free-View","");
  }
  else if (iVar1 != 1) goto LAB_0013d24a;
  str_format(aBuf,0x80,"%s",pCVar7);
LAB_0013d24a:
  CVar11 = CTextCursor::BoundingBox(&RenderSpectatorHud::s_SpectateLabelCursor);
  aVar9.x = CVar11.w + CVar11.x + 3.0;
  aVar10.y = this->m_Height + -13.0;
  if (iVar1 == 1 || ID != -1) {
    aFlag[0] = '\0';
    aFlag[1] = '\0';
    aFlag[2] = -0x80;
    aFlag[3] = '?';
    aFlag[4] = '\0';
    aFlag[5] = '\0';
    aFlag[6] = -0x80;
    aFlag[7] = '?';
    aFlag[8] = '\0';
    aFlag[9] = '\0';
    aFlag[10] = -0x80;
    aFlag[0xb] = '?';
    aFlag[0xc] = '\0';
    aFlag[0xd] = '\0';
    aFlag[0xe] = '\0';
    aFlag[0xf] = '?';
    local_118.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
    local_118.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
    local_118.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
    local_118.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    CursorPosition.field_1.y = aVar10.y;
    CursorPosition.field_0.x = aVar9.x;
    fVar8 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                              RenderSpectatorHud::s_SpectateTargetCursor.m_FontSize,CursorPosition,
                              ID,(vec4 *)aFlag,&local_118);
    aVar9.x = aVar9.x + fVar8;
  }
  RenderSpectatorHud::s_SpectateTargetCursor.m_CursorPos.field_1.y = aVar10.y;
  RenderSpectatorHud::s_SpectateTargetCursor.m_CursorPos.field_0.x = aVar9.x;
  pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
            (pIVar4,&RenderSpectatorHud::s_SpectateTargetCursor,aBuf,0xffffffffffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderSpectatorHud()
{
	const int SpecID = m_pClient->m_Snap.m_SpecInfo.m_SpectatorID;
	const int SpecMode = m_pClient->m_Snap.m_SpecInfo.m_SpecMode;

	// draw the box
	const float Width = m_Width * 0.25f - 2.0f;
	CUIRect Rect = {m_Width-Width, m_Height-15.0f, Width, 15.0f};
	Rect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.4f), 5.0f, CUIRect::CORNER_TL);

	// draw the text
	const char *pName = Config()->m_ClShowsocial && SpecID != -1 ? m_pClient->m_aClients[SpecID].m_aName : "";
	char aBuf[128];

	static CTextCursor s_SpectateLabelCursor(8.0f);
	s_SpectateLabelCursor.MoveTo(m_Width-Width+6.0f, m_Height-13.0f);
	s_SpectateLabelCursor.Reset(g_Localization.Version());
	str_format(aBuf, sizeof(aBuf), "%s: ", Localize("Spectate"));
	TextRender()->TextOutlined(&s_SpectateLabelCursor, aBuf, -1);

	static CTextCursor s_SpectateTargetCursor(8.0f);
	s_SpectateTargetCursor.Reset();

	switch(SpecMode)
	{
	case SPEC_FREEVIEW:
		str_format(aBuf, sizeof(aBuf), "%s", Localize("Free-View"));
		break;
	case SPEC_PLAYER:
		str_format(aBuf, sizeof(aBuf), "%s", pName);
		break;
	case SPEC_FLAGRED:
	case SPEC_FLAGBLUE:
		char aFlag[64];
		str_format(aFlag, sizeof(aFlag), SpecMode == SPEC_FLAGRED ? Localize("Red Flag") : Localize("Blue Flag"));

		if(SpecID != -1)
			str_format(aBuf, sizeof(aBuf), "%s (%s)", aFlag, pName);
		else
			str_format(aBuf, sizeof(aBuf), "%s", aFlag);
		break;
	}

	vec2 NamePosition = vec2(s_SpectateLabelCursor.BoundingBox().Right()+3.0f, m_Height-13.0f);
	if(SpecMode == SPEC_PLAYER || SpecID != -1)
		NamePosition.x += UI()->DrawClientID(s_SpectateTargetCursor.m_FontSize, NamePosition, SpecID);

	s_SpectateTargetCursor.MoveTo(NamePosition.x, NamePosition.y);
	TextRender()->TextOutlined(&s_SpectateTargetCursor, aBuf, -1);
}